

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O1

void embree::ISPCScene::updateLight(Ref<embree::SceneGraph::LightNode> *in,Light *out)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  long *plVar5;
  long *plVar6;
  long *plVar7;
  long *plVar8;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar14;
  float fVar15;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_38;
  
  if (in->ptr == (LightNode *)0x0) {
    plVar5 = (long *)0x0;
  }
  else {
    plVar5 = (long *)__dynamic_cast(in->ptr,&SceneGraph::LightNode::typeinfo,
                                    &SceneGraph::LightNodeImpl<embree::SceneGraph::AmbientLight>::
                                     typeinfo,0);
  }
  if (plVar5 == (long *)0x0) {
    if (in->ptr == (LightNode *)0x0) {
      plVar6 = (long *)0x0;
    }
    else {
      plVar6 = (long *)__dynamic_cast(in->ptr,&SceneGraph::LightNode::typeinfo,
                                      &SceneGraph::
                                       LightNodeImpl<embree::SceneGraph::DirectionalLight>::typeinfo
                                      ,0);
    }
    if (plVar6 == (long *)0x0) {
      if (in->ptr == (LightNode *)0x0) {
        plVar7 = (long *)0x0;
      }
      else {
        plVar7 = (long *)__dynamic_cast(in->ptr,&SceneGraph::LightNode::typeinfo,
                                        &SceneGraph::LightNodeImpl<embree::SceneGraph::DistantLight>
                                         ::typeinfo,0);
      }
      if (plVar7 == (long *)0x0) {
        if (in->ptr == (LightNode *)0x0) {
          plVar8 = (long *)0x0;
        }
        else {
          plVar8 = (long *)__dynamic_cast(in->ptr,&SceneGraph::LightNode::typeinfo,
                                          &SceneGraph::LightNodeImpl<embree::SceneGraph::PointLight>
                                           ::typeinfo,0);
        }
        if (plVar8 != (long *)0x0) {
          (**(code **)(*plVar8 + 0x10))(plVar8);
          PointLight_set(out,(Vec3fa *)(plVar8 + 0x10),(Vec3fa *)(plVar8 + 0x12),0.0);
          (**(code **)(*plVar8 + 0x18))(plVar8);
        }
      }
      else {
        (**(code **)(*plVar7 + 0x10))(plVar7);
        updateLight<embree::SceneGraph::DistantLight>((DistantLight *)(plVar7 + 0xe),out);
      }
      if (plVar7 != (long *)0x0) {
        (**(code **)(*plVar7 + 0x18))(plVar7);
      }
    }
    else {
      (**(code **)(*plVar6 + 0x10))(plVar6);
      fVar1 = *(float *)(plVar6 + 0x10);
      fVar2 = *(float *)((long)plVar6 + 0x84);
      fVar3 = *(float *)(plVar6 + 0x11);
      fVar4 = *(float *)((long)plVar6 + 0x8c);
      fVar11 = fVar2 * fVar2;
      fVar12 = fVar3 * fVar3;
      fVar13 = fVar4 * fVar4;
      fVar14 = fVar11 + fVar1 * fVar1 + fVar12;
      fVar15 = fVar11 + fVar11 + fVar13;
      fVar12 = fVar11 + fVar12 + fVar12;
      fVar13 = fVar11 + fVar13 + fVar13;
      auVar9._4_4_ = fVar15;
      auVar9._0_4_ = fVar14;
      auVar9._8_4_ = fVar12;
      auVar9._12_4_ = fVar13;
      auVar10._4_4_ = fVar15;
      auVar10._0_4_ = fVar14;
      auVar10._8_4_ = fVar12;
      auVar10._12_4_ = fVar13;
      auVar10 = rsqrtss(auVar9,auVar10);
      fVar11 = auVar10._0_4_;
      fVar11 = fVar11 * fVar11 * fVar14 * -0.5 * fVar11 + fVar11 * 1.5;
      local_38.m128[0] = -fVar1 * fVar11;
      local_38.m128[1] = -fVar2 * fVar11;
      local_38.m128[2] = -fVar3 * fVar11;
      local_38.m128[3] = -fVar4 * fVar11;
      DirectionalLight_set(out,(Vec3fa *)&local_38.field_1,(Vec3fa *)(plVar6 + 0x12),1.0);
    }
    if (plVar6 != (long *)0x0) {
      (**(code **)(*plVar6 + 0x18))(plVar6);
    }
  }
  else {
    (**(code **)(*plVar5 + 0x10))(plVar5);
    AmbientLight_set(out,(Vec3fa *)(plVar5 + 0x10));
  }
  if (plVar5 != (long *)0x0) {
    (**(code **)(*plVar5 + 0x18))(plVar5);
  }
  return;
}

Assistant:

void ISPCScene::updateLight(const Ref<SceneGraph::LightNode>& in, Light* out)
  {
    if (auto light = in.dynamicCast<SceneGraph::LightNodeImpl<SceneGraph::AmbientLight>>())
      updateLight(light->light, out);
    else if (auto light = in.dynamicCast<SceneGraph::LightNodeImpl<SceneGraph::DirectionalLight>>())
      updateLight(light->light, out);
    else if (auto light = in.dynamicCast<SceneGraph::LightNodeImpl<SceneGraph::DistantLight>>())
      updateLight(light->light, out);
    else if (auto light = in.dynamicCast<SceneGraph::LightNodeImpl<SceneGraph::PointLight>>())
      updateLight(light->light, out);
  }